

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O0

int __thiscall Fl_Input_::replace(Fl_Input_ *this,int b,int e,char *text,int ilen)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Fl_When FVar4;
  size_t sVar5;
  char *pcVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  undefined8 extraout_RDX_02;
  bool bVar8;
  int local_58;
  int local_54;
  int i;
  int ulen_1;
  int nlen;
  int ulen;
  char *p;
  int nchars;
  int t;
  int op;
  int om;
  int ul;
  int ilen_local;
  char *text_local;
  int e_local;
  int b_local;
  Fl_Input_ *this_local;
  
  was_up_down = 0;
  text_local._4_4_ = b;
  if (b < 0) {
    text_local._4_4_ = 0;
  }
  text_local._0_4_ = e;
  if (e < 0) {
    text_local._0_4_ = 0;
  }
  if (this->size_ < (int)text_local._4_4_) {
    text_local._4_4_ = this->size_;
  }
  uVar1 = text_local._4_4_;
  if (this->size_ < (int)(uint)text_local) {
    text_local._0_4_ = this->size_;
  }
  if ((int)(uint)text_local < (int)text_local._4_4_) {
    text_local._4_4_ = (uint)text_local;
    text_local._0_4_ = uVar1;
  }
  while( true ) {
    bVar8 = false;
    if (((text_local._4_4_ != (uint)text_local) && (bVar8 = false, 0 < (int)text_local._4_4_)) &&
       (bVar8 = false, 0 < (int)(this->size_ - text_local._4_4_))) {
      iVar3 = fl_utf8len(this->value_[(int)text_local._4_4_]);
      bVar8 = iVar3 < 1;
    }
    if (!bVar8) break;
    text_local._4_4_ = text_local._4_4_ - 1;
  }
  op = fl_utf8len(this->value_[(int)(uint)text_local]);
  while( true ) {
    bVar8 = false;
    if (((int)(uint)text_local < this->size_) && (bVar8 = false, 0 < (int)(uint)text_local)) {
      bVar8 = op < 0;
    }
    if (!bVar8) break;
    text_local._0_4_ = (uint)text_local + 1;
    op = fl_utf8len(this->value_[(int)(uint)text_local]);
  }
  om = ilen;
  if ((text != (char *)0x0) && (ilen == 0)) {
    sVar5 = strlen(text);
    om = (int)sVar5;
  }
  if (((int)text_local._4_4_ < (int)(uint)text_local) || (om != 0)) {
    p._0_4_ = 0;
    _nlen = this->value_;
    while ((_nlen < this->value_ + this->size_ &&
           ((_nlen != this->value_ + (int)text_local._4_4_ ||
            (_nlen = this->value_ + (int)(uint)text_local, _nlen < this->value_ + this->size_))))) {
      ulen_1 = fl_utf8len(*_nlen);
      if (ulen_1 < 1) {
        ulen_1 = 1;
      }
      p._0_4_ = (int)p + 1;
      _nlen = _nlen + ulen_1;
    }
    i = 0;
    _nlen = text;
    while( true ) {
      bVar8 = false;
      if (_nlen < text + om) {
        iVar3 = maximum_size(this);
        bVar8 = (int)p < iVar3;
      }
      if (!bVar8) break;
      local_54 = fl_utf8len(*_nlen);
      if (local_54 < 1) {
        local_54 = 1;
      }
      p._0_4_ = (int)p + 1;
      _nlen = _nlen + local_54;
      i = local_54 + i;
    }
    put_in_buffer(this,this->size_ + i);
    if ((int)text_local._4_4_ < (int)(uint)text_local) {
      if ((undowidget == this) && (text_local._4_4_ == undoat)) {
        undobuffersize(undocut + ((uint)text_local - text_local._4_4_));
        memcpy(undobuffer + undocut,this->value_ + (int)text_local._4_4_,
               (long)(int)((uint)text_local - text_local._4_4_));
        undocut = ((uint)text_local - text_local._4_4_) + undocut;
      }
      else if ((undowidget == this) && (((uint)text_local == undoat && (undoinsert == 0)))) {
        undobuffersize(undocut + ((uint)text_local - text_local._4_4_));
        memmove(undobuffer + (int)((uint)text_local - text_local._4_4_),undobuffer,(long)undocut);
        memcpy(undobuffer,this->value_ + (int)text_local._4_4_,
               (long)(int)((uint)text_local - text_local._4_4_));
        undocut = ((uint)text_local - text_local._4_4_) + undocut;
      }
      else if ((undowidget == this) &&
              (((uint)text_local == undoat &&
               ((int)((uint)text_local - text_local._4_4_) < undoinsert)))) {
        undoinsert = undoinsert - ((uint)text_local - text_local._4_4_);
      }
      else {
        undobuffersize((uint)text_local - text_local._4_4_);
        memcpy(undobuffer,this->value_ + (int)text_local._4_4_,
               (long)(int)((uint)text_local - text_local._4_4_));
        undocut = (uint)text_local - text_local._4_4_;
        undoinsert = 0;
      }
      memmove(this->buffer + (int)text_local._4_4_,this->buffer + (int)(uint)text_local,
              (long)(int)((this->size_ - (uint)text_local) + 1));
      this->size_ = this->size_ - ((uint)text_local - text_local._4_4_);
      undoat = text_local._4_4_;
      undowidget = this;
      iVar3 = input_type(this);
      if (iVar3 == 5) {
        yankcut = 0;
      }
      else {
        yankcut = undocut;
      }
    }
    if (i != 0) {
      if ((undowidget == this) && (text_local._4_4_ == undoat)) {
        undoinsert = i + undoinsert;
      }
      else {
        undocut = 0;
        undoinsert = i;
      }
      memmove(this->buffer + (long)i + (long)(int)text_local._4_4_,
              this->buffer + (int)text_local._4_4_,(long)(int)((this->size_ - text_local._4_4_) + 1)
             );
      memcpy(this->buffer + (int)text_local._4_4_,text,(long)i);
      this->size_ = i + this->size_;
    }
    uVar1 = this->mark_;
    uVar2 = this->position_;
    iVar3 = text_local._4_4_ + i;
    undowidget = this;
    undoat = iVar3;
    this->position_ = iVar3;
    this->mark_ = iVar3;
    iVar3 = wrap(this);
    if (iVar3 != 0) {
      for (local_58 = 0; (local_58 < i && (text[local_58] != ' ')); local_58 = local_58 + 1) {
      }
      uVar7 = extraout_RDX;
      if (local_58 == i) {
        while( true ) {
          bVar8 = false;
          if (0 < (int)text_local._4_4_) {
            pcVar6 = index(this,(char *)(ulong)text_local._4_4_,(int)uVar7);
            iVar3 = isspace((uint)pcVar6 & 0xff);
            bVar8 = false;
            uVar7 = extraout_RDX_00;
            if (iVar3 == 0) {
              pcVar6 = index(this,(char *)(ulong)text_local._4_4_,(int)extraout_RDX_00);
              bVar8 = (int)pcVar6 != 10;
              uVar7 = extraout_RDX_01;
            }
          }
          if (!bVar8) break;
          text_local._4_4_ = text_local._4_4_ - 1;
        }
      }
      else {
        while( true ) {
          bVar8 = false;
          if (0 < (int)text_local._4_4_) {
            pcVar6 = index(this,(char *)(ulong)text_local._4_4_,(int)uVar7);
            bVar8 = (int)pcVar6 != 10;
            uVar7 = extraout_RDX_02;
          }
          if (!bVar8) break;
          text_local._4_4_ = text_local._4_4_ - 1;
        }
      }
    }
    if ((int)uVar1 < (int)text_local._4_4_) {
      text_local._4_4_ = uVar1;
    }
    if ((int)uVar2 < (int)text_local._4_4_) {
      text_local._4_4_ = uVar2;
    }
    minimal_update(this,text_local._4_4_);
    iVar3 = undoat;
    this->position_ = undoat;
    this->mark_ = iVar3;
    Fl_Widget::set_changed(&this->super_Fl_Widget);
    FVar4 = Fl_Widget::when(&this->super_Fl_Widget);
    if ((FVar4 & FL_WHEN_CHANGED) != FL_WHEN_NEVER) {
      Fl_Widget::do_callback(&this->super_Fl_Widget);
    }
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Input_::replace(int b, int e, const char* text, int ilen) {
  int ul, om, op;
  was_up_down = 0;

  if (b<0) b = 0;
  if (e<0) e = 0;
  if (b>size_) b = size_;
  if (e>size_) e = size_;
  if (e<b) {int t=b; b=e; e=t;}
  while (b != e && b > 0 && (size_ - b) > 0 &&
       (fl_utf8len((value_ + b)[0]) < 1)) { b--; }
  ul = fl_utf8len((char)(value_ + e)[0]);
  while (e < size_ && e > 0 && ul < 0) {
       e++;
       ul = fl_utf8len((char)(value_ + e)[0]);
  }
  if (text && !ilen) ilen = (int) strlen(text);
  if (e<=b && !ilen) return 0; // don't clobber undo for a null operation

  // we must count UTF-8 *characters* to determine whether we can insert
  // the full text or only a part of it (and how much this would be)

  int nchars = 0;	// characters in value() - deleted + inserted
  const char *p = value_;
  while (p < (char *)(value_+size_)) {
    if (p == (char *)(value_+b)) { // skip removed part
      p = (char *)(value_+e);
      if (p >= (char *)(value_+size_)) break;
    }
    int ulen = fl_utf8len(*p);
    if (ulen < 1) ulen = 1; // invalid UTF-8 character: count as 1
    nchars++;
    p += ulen;
  }
  int nlen = 0;		// length (in bytes) to be inserted
  p = text;
  while (p < (char *)(text+ilen) && nchars < maximum_size()) {
    int ulen = fl_utf8len(*p);
    if (ulen < 1) ulen = 1; // invalid UTF-8 character: count as 1
    nchars++;
    p += ulen;
    nlen += ulen;
  }
  ilen = nlen;

  put_in_buffer(size_+ilen);

  if (e>b) {
    if (undowidget == this && b == undoat) {
      undobuffersize(undocut+(e-b));
      memcpy(undobuffer+undocut, value_+b, e-b);
      undocut += e-b;
    } else if (undowidget == this && e == undoat && !undoinsert) {
      undobuffersize(undocut+(e-b));
      memmove(undobuffer+(e-b), undobuffer, undocut);
      memcpy(undobuffer, value_+b, e-b);
      undocut += e-b;
    } else if (undowidget == this && e == undoat && (e-b)<undoinsert) {
      undoinsert -= e-b;
    } else {
      undobuffersize(e-b);
      memcpy(undobuffer, value_+b, e-b);
      undocut = e-b;
      undoinsert = 0;
    }
    memmove(buffer+b, buffer+e, size_-e+1);
    size_ -= e-b;
    undowidget = this;
    undoat = b;
    if (input_type() == FL_SECRET_INPUT) yankcut = 0; else yankcut = undocut;
  }

  if (ilen) {
    if (undowidget == this && b == undoat)
      undoinsert += ilen;
    else {
      undocut = 0;
      undoinsert = ilen;
    }
    memmove(buffer+b+ilen, buffer+b, size_-b+1);
    memcpy(buffer+b, text, ilen);
    size_ += ilen;
  }
  undowidget = this;
  om = mark_;
  op = position_;
  mark_ = position_ = undoat = b+ilen;

  // Insertions into the word at the end of the line will cause it to
  // wrap to the next line, so we must indicate that the changes may start
  // right after the whitespace before the current word.  This will
  // result in sub-optimal update when such wrapping does not happen
  // but it is too hard to figure out for now...
  if (wrap()) {
    // if there is a space in the pasted text, the whole line may have rewrapped
    int i;
    for (i=0; i<ilen; i++)
      if (text[i]==' ') break;
    if (i==ilen)
      while (b > 0 && !isspace(index(b) & 255) && index(b)!='\n') b--;
    else
      while (b > 0 && index(b)!='\n') b--;
  }

  // make sure we redraw the old selection or cursor:
  if (om < b) b = om;
  if (op < b) b = op;

  minimal_update(b);

  mark_ = position_ = undoat;

  set_changed();
  if (when()&FL_WHEN_CHANGED) do_callback();
  return 1;
}